

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UMatchDegree __thiscall
icu_63::UnicodeSet::matches
          (UnicodeSet *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  short sVar1;
  uint uVar2;
  UBool UVar3;
  char16_t cVar4;
  UMatchDegree UVar5;
  int iVar6;
  UnicodeString *this_00;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int index;
  int32_t iVar11;
  
  uVar2 = *offset;
  if (uVar2 == limit) {
    UVar3 = contains(this,0xffff);
    if (UVar3 == '\0') {
      UVar5 = U_MISMATCH;
    }
    else {
      UVar5 = (incremental == '\0') + U_PARTIAL_MATCH;
    }
    return UVar5;
  }
  if (this->strings->count != 0) {
    iVar6 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)uVar2);
    iVar11 = 0;
    for (index = 0; iVar9 = iVar11, index < this->strings->count; index = index + 1) {
      this_00 = (UnicodeString *)UVector::elementAt(this->strings,index);
      iVar10 = 0;
      if (limit <= (int)uVar2) {
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar10 = (this_00->fUnion).fFields.fLength;
        }
        else {
          iVar10 = (int)sVar1 >> 5;
        }
        iVar10 = iVar10 + -1;
      }
      cVar4 = UnicodeString::doCharAt(this_00,iVar10);
      if (((int)uVar2 < limit) && ((ushort)(char16_t)iVar6 < (ushort)cVar4)) break;
      if (cVar4 == (char16_t)iVar6) {
        iVar10 = matchRest(text,*offset,limit,this_00);
        if (incremental != '\0') {
          iVar7 = *offset - limit;
          if ((int)uVar2 < limit) {
            iVar7 = limit - *offset;
          }
          if (iVar10 == iVar7) {
            return U_PARTIAL_MATCH;
          }
        }
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar8 = (this_00->fUnion).fFields.fLength;
        }
        else {
          iVar8 = (int)sVar1 >> 5;
        }
        if (iVar10 == iVar8) {
          if (iVar11 < iVar10) {
            iVar9 = iVar10;
          }
          if (((int)uVar2 < limit) && (iVar10 < iVar11)) break;
        }
      }
      iVar11 = iVar9;
    }
    if (iVar9 != 0) {
      iVar6 = -iVar9;
      if ((int)uVar2 < limit) {
        iVar6 = iVar9;
      }
      *offset = *offset + iVar6;
      return U_MATCH;
    }
  }
  UVar5 = UnicodeFilter::matches(&this->super_UnicodeFilter,text,offset,limit,incremental);
  return UVar5;
}

Assistant:

UMatchDegree UnicodeSet::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    if (offset == limit) {
        // Strings, if any, have length != 0, so we don't worry
        // about them here.  If we ever allow zero-length strings
        // we much check for them here.
        if (contains(U_ETHER)) {
            return incremental ? U_PARTIAL_MATCH : U_MATCH;
        } else {
            return U_MISMATCH;
        }
    } else {
        if (strings->size() != 0) { // try strings first

            // might separate forward and backward loops later
            // for now they are combined

            // TODO Improve efficiency of this, at least in the forward
            // direction, if not in both.  In the forward direction we
            // can assume the strings are sorted.

            int32_t i;
            UBool forward = offset < limit;

            // firstChar is the leftmost char to match in the
            // forward direction or the rightmost char to match in
            // the reverse direction.
            UChar firstChar = text.charAt(offset);

            // If there are multiple strings that can match we
            // return the longest match.
            int32_t highWaterLength = 0;

            for (i=0; i<strings->size(); ++i) {
                const UnicodeString& trial = *(const UnicodeString*)strings->elementAt(i);

                //if (trial.length() == 0) {
                //    return U_MATCH; // null-string always matches
                //}
                // assert(trial.length() != 0); // We ensure this elsewhere

                UChar c = trial.charAt(forward ? 0 : trial.length() - 1);

                // Strings are sorted, so we can optimize in the
                // forward direction.
                if (forward && c > firstChar) break;
                if (c != firstChar) continue;

                int32_t matchLen = matchRest(text, offset, limit, trial);

                if (incremental) {
                    int32_t maxLen = forward ? limit-offset : offset-limit;
                    if (matchLen == maxLen) {
                        // We have successfully matched but only up to limit.
                        return U_PARTIAL_MATCH;
                    }
                }

                if (matchLen == trial.length()) {
                    // We have successfully matched the whole string.
                    if (matchLen > highWaterLength) {
                        highWaterLength = matchLen;
                    }
                    // In the forward direction we know strings
                    // are sorted so we can bail early.
                    if (forward && matchLen < highWaterLength) {
                        break;
                    }
                    continue;
                }
            }

            // We've checked all strings without a partial match.
            // If we have full matches, return the longest one.
            if (highWaterLength != 0) {
                offset += forward ? highWaterLength : -highWaterLength;
                return U_MATCH;
            }
        }
        return UnicodeFilter::matches(text, offset, limit, incremental);
    }
}